

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satUtil.c
# Opt level: O0

int * Sat_Solver2GetModel(sat_solver2 *p,int *pVars,int nVars)

{
  int iVar1;
  int *piVar2;
  int local_2c;
  int i;
  int *pModel;
  int nVars_local;
  int *pVars_local;
  sat_solver2 *p_local;
  
  piVar2 = (int *)calloc((long)(nVars + 1),4);
  for (local_2c = 0; local_2c < nVars; local_2c = local_2c + 1) {
    iVar1 = sat_solver2_var_value(p,pVars[local_2c]);
    piVar2[local_2c] = iVar1;
  }
  return piVar2;
}

Assistant:

int * Sat_Solver2GetModel( sat_solver2 * p, int * pVars, int nVars )
{
    int * pModel;
    int i;
    pModel = ABC_CALLOC( int, nVars+1 );
    for ( i = 0; i < nVars; i++ )
        pModel[i] = sat_solver2_var_value(p, pVars[i]);
    return pModel;    
}